

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

FileOptions * __thiscall
google::protobuf::DescriptorPool::Tables::AllocateMessage<google::protobuf::FileOptions>
          (Tables *this,FileOptions *param_1)

{
  FileOptions *this_00;
  FileOptions *local_18;
  
  this_00 = (FileOptions *)operator_new(0xb0);
  FileOptions::FileOptions(this_00);
  local_18 = this_00;
  std::vector<google::protobuf::Message*,std::allocator<google::protobuf::Message*>>::
  emplace_back<google::protobuf::Message*>
            ((vector<google::protobuf::Message*,std::allocator<google::protobuf::Message*>> *)
             &this->messages_,(Message **)&local_18);
  return this_00;
}

Assistant:

Type* DescriptorPool::Tables::AllocateMessage(Type* /* dummy */) {
  Type* result = new Type;
  messages_.push_back(result);
  return result;
}